

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::ascii_internal::AsciiStrCaseFoldLong<true>
               (Nonnull<char_*> dst,Nonnull<const_char_*> src,size_t size)

{
  byte c;
  bool bVar1;
  byte bVar2;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uchar v;
  size_t i;
  uchar kAsciiCaseBitFlip;
  ulong local_28;
  
  if (0xf < in_RDX) {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      c = *(byte *)(in_RSI + local_28);
      bVar1 = AsciiInAZRange<true>(c);
      bVar2 = 0;
      if (bVar1) {
        bVar2 = 0x20;
      }
      *(byte *)(in_RDI + local_28) = c ^ bVar2;
    }
    return;
  }
  __assert_fail("size >= kCaseFoldThreshold",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/ascii.cc"
                ,0xcd,
                "void absl::ascii_internal::AsciiStrCaseFoldLong(absl::Nonnull<char *>, absl::Nonnull<const char *>, size_t) [ToUpper = true]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE constexpr void AsciiStrCaseFoldLong(
    absl::Nonnull<char*> dst, absl::Nonnull<const char*> src, size_t size) {
  ABSL_ASSUME(size >= kCaseFoldThreshold);
  AsciiStrCaseFoldImpl<ToUpper>(dst, src, size);
}